

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method_reset(jit_State *J,RecordFFData *rd)

{
  ulong uVar1;
  IRRef1 IVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  IRRef1 IVar6;
  IRRef1 IVar7;
  IRRef1 IVar8;
  
  TVar3 = recff_sbufx_check(J,rd,0);
  uVar1 = *(ulong *)((rd->argv->u64 & 0x7fffffffffff) + 0x48);
  IVar6 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op1 = IVar6;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090011;
  TVar3 = lj_opt_fold(J);
  TVar4 = lj_ir_kint64(J,2);
  (J->fold).ins.field_0.ot = 0x2115;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
  TVar4 = lj_opt_fold(J);
  TVar5 = lj_ir_kint64(J,0);
  (J->fold).ins.field_0.ot = (ushort)(((uint)uVar1 & 2) << 7) | 0x895;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
  IVar7 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = IVar7;
  lj_opt_fold(J);
  if ((uVar1 & 2) == 0) {
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090010;
    TVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000e;
    TVar4 = lj_opt_fold(J);
    IVar2 = (IRRef1)TVar4;
    IVar8 = (IRRef1)TVar3;
    IVar7 = IVar8;
  }
  else {
    TVar4 = lj_ir_kint64(J,0);
    IVar8 = (IRRef1)TVar4;
    TVar4 = lj_ir_kint64(J,2);
    (J->fold).ins.field_0.ot = 0x2315;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    TVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000e;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar8;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000f;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar8;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090010;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar8;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090011;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = IVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090012;
    TVar3 = lj_opt_fold(J);
    IVar2 = (IRRef1)TVar3;
  }
  (J->fold).ins.field_0.ot = 0x4d09;
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = IVar7;
  lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar6;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090013;
  TVar3 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x4d09;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = IVar8;
  lj_opt_fold(J);
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_reset(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  SBufExt *sbx = bufV(&rd->argv[0]);
  int iscow = (int)sbufiscow(sbx);
  TRef trl = recff_sbufx_get_L(J, ud);
  TRef trcow = emitir(IRT(IR_BAND, IRT_IGC), trl, lj_ir_kintpgc(J, SBUF_FLAG_COW));
  TRef zeropgc = lj_ir_kintpgc(J, 0);
  emitir(IRTG(iscow ? IR_NE : IR_EQ, IRT_IGC), trcow, zeropgc);
  if (iscow) {
    TRef zerop = lj_ir_kintp(J, 0);
    trl = emitir(IRT(IR_BXOR, IRT_IGC), trl, lj_ir_kintpgc(J, SBUF_FLAG_COW));
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_W, zerop);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_E, zerop);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_B, zerop);
    recff_sbufx_set_L(J, ud, trl);
    emitir(IRT(IR_FSTORE, IRT_PGC),
	   emitir(IRT(IR_FREF, IRT_PGC), ud, IRFL_SBUF_REF), zeropgc);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, zerop);
  } else {
    TRef trb = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_B);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_W, trb);
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trb);
  }
}